

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O3

int __thiscall Fl_RGB_Image::copy(Fl_RGB_Image *this,int W,int H)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uchar *puVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  size_t __n;
  uint uVar14;
  int iVar15;
  int iVar16;
  uchar *src;
  uint uVar17;
  float fVar18;
  undefined4 in_XMM1_Db;
  undefined4 uVar19;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  uchar downright [4];
  uchar downleft [4];
  uchar right [4];
  uchar left [4];
  byte local_120 [4];
  byte local_11c [4];
  byte local_118 [4];
  byte local_114 [4];
  ulong local_110;
  int local_104;
  ulong local_100;
  int local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 *local_d8;
  ulong local_d0;
  void *local_c8;
  uchar *local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  uchar *local_a0;
  long local_98;
  uchar *local_90;
  float local_88;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  undefined4 uStack_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar19 = 0;
  uVar17 = (this->super_Fl_Image).w_;
  local_110 = (ulong)uVar17;
  iVar1 = (this->super_Fl_Image).h_;
  if ((iVar1 != 0 && uVar17 != 0) && (iVar1 != H || uVar17 != W)) {
    uVar2 = (this->super_Fl_Image).d_;
    __n = (size_t)(int)uVar2;
    if ((__n != 0) && (local_c0 = this->array, local_c0 != (uchar *)0x0)) {
      if (H < 1 || W < 1) {
        local_d8 = (undefined8 *)0x0;
      }
      else {
        pvVar4 = operator_new__((long)(int)(H * W * uVar2));
        local_d8 = (undefined8 *)operator_new(0x40);
        *(int *)(local_d8 + 1) = W;
        *(int *)((long)local_d8 + 0xc) = H;
        *(uint *)(local_d8 + 2) = uVar2;
        *local_d8 = &PTR__Fl_RGB_Image_00278218;
        local_d8[5] = pvVar4;
        *(undefined4 *)(local_d8 + 7) = 0;
        local_d8[4] = local_d8 + 5;
        *(undefined8 *)((long)local_d8 + 0x14) = 0x100000000;
        local_d8[6] = 1;
        iVar12 = (this->super_Fl_Image).ld_;
        iVar9 = (int)local_110;
        local_104 = uVar2 * iVar9;
        if (iVar12 != 0) {
          local_104 = iVar12;
        }
        if (Fl_Image::RGB_scaling_ == FL_RGB_SCALING_NEAREST) {
          uVar6 = (ulong)(uint)(iVar9 >> 0x1f) << 0x20 | local_110 & 0xffffffff;
          iVar8 = 0;
          iVar12 = H;
          iVar9 = H;
          do {
            puVar10 = this->array + iVar8 * local_104;
            iVar11 = W;
            iVar15 = W;
            do {
              if (0 < (int)__n) {
                lVar7 = 0;
                do {
                  *(uchar *)((long)pvVar4 + lVar7) = puVar10[lVar7];
                  lVar7 = lVar7 + 1;
                  __n = (size_t)(this->super_Fl_Image).d_;
                } while (lVar7 < (long)__n);
                pvVar4 = (void *)((long)pvVar4 + lVar7);
              }
              iVar11 = iVar11 - (int)((long)uVar6 % (long)W);
              iVar16 = 0;
              if (iVar11 < 1) {
                iVar16 = W;
              }
              iVar13 = 0;
              if (iVar11 < 1) {
                iVar13 = (int)__n;
              }
              iVar11 = iVar11 + iVar16;
              puVar10 = puVar10 + (long)iVar13 + (long)(int)((int)((long)uVar6 / (long)W) * uVar2);
              bVar3 = 1 < iVar15;
              iVar15 = iVar15 + -1;
            } while (bVar3);
            iVar11 = iVar9 - iVar1 % H;
            iVar9 = 0;
            if (iVar11 < 1) {
              iVar9 = H;
            }
            iVar9 = iVar11 + iVar9;
            iVar8 = iVar8 + iVar1 / H + (uint)(iVar11 < 1);
            bVar3 = 1 < iVar12;
            iVar12 = iVar12 + -1;
          } while (bVar3);
        }
        else {
          local_58 = (float)(iVar9 + -1);
          local_78 = (float)(iVar1 + -1);
          local_68 = local_58 / (float)W;
          local_f4 = (float)iVar1;
          local_88 = local_78 / (float)H;
          local_f0 = (float)iVar9;
          local_f8 = uVar2 * W;
          local_d0 = (ulong)(uint)H;
          local_a8 = (ulong)(uint)W;
          local_b0 = 0;
          local_b8 = 0;
          local_c8 = pvVar4;
          uStack_74 = in_XMM2_Db;
          uStack_70 = in_XMM2_Dc;
          uStack_6c = in_XMM2_Dd;
          uStack_60 = uVar19;
          uStack_54 = in_XMM1_Db;
          uStack_50 = uVar19;
          uStack_4c = in_XMM1_Dd;
          do {
            fVar18 = (float)(int)local_b8 * local_88;
            uVar17 = -(uint)(fVar18 < local_f4);
            fVar18 = (float)(~uVar17 & (uint)local_78 | (uint)fVar18 & uVar17);
            lVar7 = (long)(int)local_b0 + (long)local_c8;
            uVar17 = -(uint)(local_f4 <= fVar18 + 1.0);
            local_48 = fVar18 - (float)((long)fVar18 & 0xffffffff);
            local_98 = (long)(local_f8 * (int)local_b8) + (long)local_c8;
            local_90 = local_c0 + (uint)((int)(long)fVar18 * local_104);
            local_a0 = local_c0 +
                       (uint)((int)(long)(float)(~uVar17 & (uint)(fVar18 + 1.0) |
                                                uVar17 & (uint)fVar18) * local_104);
            local_ec = 1.0 - local_48;
            local_110 = 0;
            uStack_44 = uStack_74;
            uStack_40 = uStack_70;
            uStack_3c = uStack_6c;
            do {
              puVar10 = local_90;
              fVar18 = (float)(int)local_110 * local_68;
              uVar17 = -(uint)(fVar18 < local_f0);
              fVar18 = (float)(~uVar17 & (uint)local_58 | (uint)fVar18 & uVar17);
              local_100 = (ulong)fVar18;
              uVar17 = -(uint)(local_f0 <= fVar18 + 1.0);
              local_e8 = (void *)CONCAT44(uStack_54,fVar18);
              uStack_e0 = uStack_50;
              uStack_dc = uStack_4c;
              uVar14 = uVar2 * (int)local_100;
              memcpy(local_114,local_90 + uVar14,__n);
              uVar17 = (int)(long)(float)(~uVar17 & (uint)(fVar18 + 1.0) | uVar17 & (uint)fVar18) *
                       uVar2;
              memcpy(local_118,puVar10 + uVar17,__n);
              puVar10 = local_a0;
              memcpy(local_11c,local_a0 + uVar14,__n);
              memcpy(local_120,puVar10 + uVar17,__n);
              if (uVar2 == 4) {
                lVar5 = 0;
                do {
                  local_114[lVar5] =
                       (byte)(int)((float)((uint)local_114[3] * (uint)local_114[lVar5]) / 255.0);
                  local_118[lVar5] =
                       (byte)(int)((float)((uint)local_118[3] * (uint)local_118[lVar5]) / 255.0);
                  local_11c[lVar5] =
                       (byte)(int)((float)((uint)local_11c[3] * (uint)local_11c[lVar5]) / 255.0);
                  local_120[lVar5] =
                       (byte)(int)((float)((uint)local_120[3] * (uint)local_120[lVar5]) / 255.0);
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 3);
              }
              if (0 < (int)uVar2) {
                local_e8._0_4_ = (float)local_e8 - (float)(local_100 & 0xffffffff);
                uVar6 = 0;
                do {
                  *(char *)(lVar7 + uVar6) =
                       (char)(int)(((float)local_11c[uVar6] * (1.0 - (float)local_e8) +
                                   (float)local_120[uVar6] * (float)local_e8) * local_48 +
                                  ((float)local_114[uVar6] * (1.0 - (float)local_e8) +
                                  (float)local_118[uVar6] * (float)local_e8) * local_ec);
                  uVar6 = uVar6 + 1;
                } while (uVar2 != uVar6);
                if ((uVar2 == 4) && (*(char *)(local_98 + 3 + local_110 * __n) != '\0')) {
                  lVar5 = 0;
                  do {
                    *(char *)(lVar7 + lVar5) =
                         (char)(int)((float)*(byte *)(lVar7 + lVar5) /
                                    ((float)*(byte *)(local_98 + 3 + local_110 * __n) / 255.0));
                    lVar5 = lVar5 + 1;
                  } while (lVar5 != 3);
                }
              }
              local_110 = local_110 + 1;
              lVar7 = lVar7 + __n;
            } while (local_110 != local_a8);
            local_b8 = local_b8 + 1;
            local_b0 = (ulong)(uint)((int)local_b0 + local_f8);
          } while (local_b8 != local_d0);
        }
      }
      goto LAB_001b7ce6;
    }
  }
  puVar10 = this->array;
  if (puVar10 == (uchar *)0x0) {
    local_d8 = (undefined8 *)operator_new(0x40);
    *(uint *)(local_d8 + 1) = uVar17;
    *(int *)((long)local_d8 + 0xc) = iVar1;
    *local_d8 = &PTR__Fl_RGB_Image_00278218;
    local_d8[5] = 0;
    local_d8[6] = 0;
    *(undefined4 *)(local_d8 + 7) = 0;
    local_d8[4] = local_d8 + 5;
    *(undefined4 *)(local_d8 + 3) = 1;
    local_d8[2] = *(undefined8 *)&(this->super_Fl_Image).d_;
  }
  else {
    iVar12 = (this->super_Fl_Image).d_;
    local_100 = CONCAT44(local_100._4_4_,iVar12);
    iVar12 = iVar12 * uVar17;
    pvVar4 = operator_new__((long)(iVar12 * iVar1));
    iVar9 = (this->super_Fl_Image).ld_;
    local_e8 = pvVar4;
    if (iVar9 == iVar12 || iVar9 == 0) {
      memcpy(pvVar4,puVar10,(long)(iVar12 * iVar1));
    }
    else if (0 < iVar1) {
      iVar8 = iVar1;
      do {
        memcpy(pvVar4,puVar10,(long)iVar12);
        puVar10 = puVar10 + iVar9;
        pvVar4 = (void *)((long)pvVar4 + (long)iVar12);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    local_d8 = (undefined8 *)operator_new(0x40);
    *(int *)(local_d8 + 1) = (int)local_110;
    *(int *)((long)local_d8 + 0xc) = iVar1;
    *(undefined4 *)(local_d8 + 2) = (undefined4)local_100;
    *local_d8 = &PTR__Fl_RGB_Image_00278218;
    local_d8[5] = local_e8;
    *(undefined4 *)(local_d8 + 7) = 0;
    local_d8[4] = local_d8 + 5;
    *(undefined8 *)((long)local_d8 + 0x14) = 0x100000000;
    local_d8[6] = 1;
  }
LAB_001b7ce6:
  return (int)local_d8;
}

Assistant:

Fl_Image *Fl_RGB_Image::copy(int W, int H) {
  Fl_RGB_Image	*new_image;	// New RGB image
  uchar		*new_array;	// New array for image data

  // Optimize the simple copy where the width and height are the same,
  // or when we are copying an empty image...
  if ((W == w() && H == h()) ||
      !w() || !h() || !d() || !array) {
    if (array) {
      // Make a copy of the image data and return a new Fl_RGB_Image...
      new_array = new uchar[w() * h() * d()];
      if (ld() && ld()!=w()*d()) {
        const uchar *src = array;
        uchar *dst = new_array;
        int dy, dh = h(), wd = w()*d(), wld = ld();
        for (dy=0; dy<dh; dy++) {
          memcpy(dst, src, wd);
          src += wld;
          dst += wd;
        }
      } else {
        memcpy(new_array, array, w() * h() * d());
      }
      new_image = new Fl_RGB_Image(new_array, w(), h(), d());
      new_image->alloc_array = 1;

      return new_image;
    } else {
      return new Fl_RGB_Image(array, w(), h(), d(), ld());
    }
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and create new image
  uchar		*new_ptr;	// Pointer into new array
  const uchar	*old_ptr;	// Pointer into old array
  int		dx, dy,		// Destination coordinates
		line_d;		// stride from line to line

  // Allocate memory for the new image...
  new_array = new uchar [W * H * d()];
  new_image = new Fl_RGB_Image(new_array, W, H, d());
  new_image->alloc_array = 1;

  line_d = ld() ? ld() : w() * d();

  if (Fl_Image::RGB_scaling() == FL_RGB_SCALING_NEAREST) {

    int		c,		// Channel number
		sy,		// Source coordinate
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments

    // Figure out Bresenham step/modulus values...
    xmod   = w() % W;
    xstep  = (w() / W) * d();
    ymod   = h() % H;
    ystep  = h() / H;

    // Scale the image using a nearest-neighbor algorithm...
    for (dy = H, sy = 0, yerr = H, new_ptr = new_array; dy > 0; dy --) {
      for (dx = W, xerr = W, old_ptr = array + sy * line_d; dx > 0; dx --) {
        for (c = 0; c < d(); c ++) *new_ptr++ = old_ptr[c];

        old_ptr += xstep;
        xerr    -= xmod;

        if (xerr <= 0) {
          xerr    += W;
	  old_ptr += d();
        }
      }

      sy   += ystep;
      yerr -= ymod;
      if (yerr <= 0) {
        yerr += H;
        sy ++;
      }
    }
  } else {
    // Bilinear scaling (FL_RGB_SCALING_BILINEAR)
    const float xscale = (w() - 1) / (float) W;
    const float yscale = (h() - 1) / (float) H;
    for (dy = 0; dy < H; dy++) {
      float oldy = dy * yscale;
      if (oldy >= h())
        oldy = float(h() - 1);
      const float yfract = oldy - (unsigned) oldy;

      for (dx = 0; dx < W; dx++) {
        new_ptr = new_array + dy * W * d() + dx * d();

        float oldx = dx * xscale;
        if (oldx >= w())
          oldx = float(w() - 1);
        const float xfract = oldx - (unsigned) oldx;

        const unsigned leftx = (unsigned)oldx;
        const unsigned lefty = (unsigned)oldy;
        const unsigned rightx = (unsigned)(oldx + 1 >= w() ? oldx : oldx + 1);
        const unsigned righty = (unsigned)oldy;
        const unsigned dleftx = (unsigned)oldx;
        const unsigned dlefty = (unsigned)(oldy + 1 >= h() ? oldy : oldy + 1);
        const unsigned drightx = (unsigned)rightx;
        const unsigned drighty = (unsigned)dlefty;

        uchar left[4], right[4], downleft[4], downright[4];
        memcpy(left, array + lefty * line_d + leftx * d(), d());
        memcpy(right, array + righty * line_d + rightx * d(), d());
        memcpy(downleft, array + dlefty * line_d + dleftx * d(), d());
        memcpy(downright, array + drighty * line_d + drightx * d(), d());

        int i;
        if (d() == 4) {
          for (i = 0; i < 3; i++) {
            left[i] = (uchar)(left[i] * left[3] / 255.0f);
            right[i] = (uchar)(right[i] * right[3] / 255.0f);
            downleft[i] = (uchar)(downleft[i] * downleft[3] / 255.0f);
            downright[i] = (uchar)(downright[i] * downright[3] / 255.0f);
          }
        }

	const float leftf = 1 - xfract;
	const float rightf = xfract;
	const float upf = 1 - yfract;
	const float downf = yfract;

        for (i = 0; i < d(); i++) {
          new_ptr[i] = (uchar)((left[i] * leftf +
                   right[i] * rightf) * upf +
                   (downleft[i] * leftf +
                   downright[i] * rightf) * downf);
        }

        if (d() == 4 && new_ptr[3]) {
          for (i = 0; i < 3; i++) {
            new_ptr[i] = (uchar)(new_ptr[i] / (new_ptr[3] / 255.0f));
          }
        }
      }
    }
  }

  return new_image;
}